

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int tonum(lua_State *L,int arg)

{
  int iVar1;
  uint uVar2;
  size_t in_RAX;
  char *s;
  size_t sVar3;
  size_t len;
  size_t local_18;
  
  local_18 = in_RAX;
  iVar1 = lua_type(L,arg);
  if (iVar1 == 3) {
    lua_pushvalue(L,arg);
    uVar2 = 1;
  }
  else {
    s = lua_tolstring(L,arg,&local_18);
    if (s == (char *)0x0) {
      uVar2 = 0;
    }
    else {
      sVar3 = lua_stringtonumber(L,s);
      uVar2 = (uint)(sVar3 == local_18 + 1);
    }
  }
  return uVar2;
}

Assistant:

static int tonum (lua_State *L, int arg) {
  if (lua_type(L, arg) == LUA_TNUMBER) {  /* already a number? */
    lua_pushvalue(L, arg);
    return 1;
  }
  else {  /* check whether it is a numerical string */
    size_t len;
    const char *s = lua_tolstring(L, arg, &len);
    return (s != NULL && lua_stringtonumber(L, s) == len + 1);
  }
}